

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O3

void xmlXPtrEvalRangePredicate(xmlXPathParserContextPtr ctxt)

{
  long lVar1;
  byte bVar2;
  int *piVar3;
  xmlChar *pxVar4;
  xmlNodePtr val;
  int iVar5;
  byte *pbVar6;
  xmlXPathObjectPtr pxVar7;
  xmlLocationSetPtr cur;
  xmlXPathContextPtr pxVar8;
  xmlXPathObjectPtr pxVar9;
  xmlXPathObjectPtr res;
  xmlXPathObjectPtr val_00;
  byte *pbVar10;
  long lVar11;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  pbVar10 = ctxt->cur;
  while( true ) {
    pbVar6 = pbVar10 + 1;
    bVar2 = *pbVar10;
    if ((0x20 < (ulong)bVar2) || ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) break;
    ctxt->cur = pbVar6;
    pbVar10 = pbVar6;
  }
  if (bVar2 == 0x5b) {
    while( true ) {
      ctxt->cur = pbVar6;
      if ((0x20 < (ulong)*pbVar6) || ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) == 0)) break;
      pbVar6 = pbVar6 + 1;
    }
    iVar5 = 0xb;
    if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type == XPATH_LOCATIONSET)) {
      pxVar7 = valuePop(ctxt);
      piVar3 = (int *)pxVar7->user;
      pxVar8 = ctxt->context;
      pxVar8->node = (xmlNodePtr)0x0;
      if ((piVar3 == (int *)0x0) || (*piVar3 == 0)) {
        pxVar8->contextSize = 0;
        pxVar8->proximityPosition = 0;
        xmlXPathEvalExpr(ctxt);
        pxVar9 = valuePop(ctxt);
        if (pxVar9 != (xmlXPathObjectPtr)0x0) {
          xmlXPathFreeObject(pxVar9);
        }
        valuePush(ctxt,pxVar7);
        if (ctxt->error != 0) {
          return;
        }
      }
      else {
        pxVar4 = ctxt->cur;
        cur = (xmlLocationSetPtr)(*xmlMalloc)(0x10);
        if (cur == (xmlLocationSetPtr)0x0) {
          xmlXPtrErrMemory("allocating locationset");
        }
        else {
          cur->locNr = 0;
          cur->locMax = 0;
          cur->locTab = (xmlXPathObjectPtr *)0x0;
        }
        if (0 < *piVar3) {
          pxVar8 = ctxt->context;
          lVar11 = 0;
          do {
            ctxt->cur = pxVar4;
            val = *(xmlNodePtr *)(*(long *)(*(long *)(piVar3 + 2) + lVar11 * 8) + 0x28);
            pxVar8->node = val;
            pxVar9 = xmlXPathNewNodeSet(val);
            valuePush(ctxt,pxVar9);
            pxVar8 = ctxt->context;
            pxVar8->contextSize = *piVar3;
            lVar1 = lVar11 + 1;
            pxVar8->proximityPosition = (int)lVar1;
            xmlXPathEvalExpr(ctxt);
            if (ctxt->error != 0) {
              return;
            }
            res = valuePop(ctxt);
            iVar5 = xmlXPathEvaluatePredicateResult(ctxt,res);
            if (iVar5 != 0) {
              val_00 = xmlXPathObjectCopy(*(xmlXPathObjectPtr *)(*(long *)(piVar3 + 2) + lVar11 * 8)
                                         );
              xmlXPtrLocationSetAdd(cur,val_00);
            }
            if (res != (xmlXPathObjectPtr)0x0) {
              xmlXPathFreeObject(res);
            }
            if (ctxt->value == pxVar9) {
              pxVar9 = valuePop(ctxt);
              xmlXPathFreeObject(pxVar9);
            }
            pxVar8 = ctxt->context;
            pxVar8->node = (xmlNodePtr)0x0;
            lVar11 = lVar1;
          } while (lVar1 < *piVar3);
        }
        xmlXPathFreeObject(pxVar7);
        pxVar8 = ctxt->context;
        pxVar8->node = (xmlNodePtr)0x0;
        pxVar8->contextSize = -1;
        pxVar8->proximityPosition = -1;
        pxVar7 = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
        if (pxVar7 == (xmlXPathObjectPtr)0x0) {
          xmlXPtrErrMemory("allocating locationset");
        }
        else {
          *(undefined8 *)pxVar7 = 0;
          pxVar7->nodesetval = (xmlNodeSetPtr)0x0;
          pxVar7->stringval = (xmlChar *)0x0;
          pxVar7->user = (void *)0x0;
          *(undefined8 *)&pxVar7->index = 0;
          pxVar7->user2 = (void *)0x0;
          *(undefined8 *)&pxVar7->boolval = 0;
          pxVar7->floatval = 0.0;
          *(undefined8 *)&pxVar7->index2 = 0;
          pxVar7->type = XPATH_LOCATIONSET;
          pxVar7->user = cur;
        }
        valuePush(ctxt,pxVar7);
      }
      pbVar10 = ctxt->cur;
      iVar5 = 6;
      if (*pbVar10 == 0x5d) {
        do {
          pbVar10 = pbVar10 + 1;
          ctxt->cur = pbVar10;
          if (0x20 < (ulong)*pbVar10) {
            return;
          }
        } while ((0x100002600U >> ((ulong)*pbVar10 & 0x3f) & 1) != 0);
        return;
      }
    }
  }
  else {
    iVar5 = 6;
  }
  xmlXPathErr(ctxt,iVar5);
  return;
}

Assistant:

void
xmlXPtrEvalRangePredicate(xmlXPathParserContextPtr ctxt) {
    const xmlChar *cur;
    xmlXPathObjectPtr res;
    xmlXPathObjectPtr obj, tmp;
    xmlLocationSetPtr newset = NULL;
    xmlLocationSetPtr oldset;
    int i;

    if (ctxt == NULL) return;

    SKIP_BLANKS;
    if (CUR != '[') {
	XP_ERROR(XPATH_INVALID_PREDICATE_ERROR);
    }
    NEXT;
    SKIP_BLANKS;

    /*
     * Extract the old set, and then evaluate the result of the
     * expression for all the element in the set. use it to grow
     * up a new set.
     */
    CHECK_TYPE(XPATH_LOCATIONSET);
    obj = valuePop(ctxt);
    oldset = obj->user;
    ctxt->context->node = NULL;

    if ((oldset == NULL) || (oldset->locNr == 0)) {
	ctxt->context->contextSize = 0;
	ctxt->context->proximityPosition = 0;
	xmlXPathEvalExpr(ctxt);
	res = valuePop(ctxt);
	if (res != NULL)
	    xmlXPathFreeObject(res);
	valuePush(ctxt, obj);
	CHECK_ERROR;
    } else {
	/*
	 * Save the expression pointer since we will have to evaluate
	 * it multiple times. Initialize the new set.
	 */
        cur = ctxt->cur;
	newset = xmlXPtrLocationSetCreate(NULL);

        for (i = 0; i < oldset->locNr; i++) {
	    ctxt->cur = cur;

	    /*
	     * Run the evaluation with a node list made of a single item
	     * in the nodeset.
	     */
	    ctxt->context->node = oldset->locTab[i]->user;
	    tmp = xmlXPathNewNodeSet(ctxt->context->node);
	    valuePush(ctxt, tmp);
	    ctxt->context->contextSize = oldset->locNr;
	    ctxt->context->proximityPosition = i + 1;

	    xmlXPathEvalExpr(ctxt);
	    CHECK_ERROR;

	    /*
	     * The result of the evaluation need to be tested to
	     * decided whether the filter succeeded or not
	     */
	    res = valuePop(ctxt);
	    if (xmlXPathEvaluatePredicateResult(ctxt, res)) {
	        xmlXPtrLocationSetAdd(newset,
			xmlXPathObjectCopy(oldset->locTab[i]));
	    }

	    /*
	     * Cleanup
	     */
	    if (res != NULL)
		xmlXPathFreeObject(res);
	    if (ctxt->value == tmp) {
		res = valuePop(ctxt);
		xmlXPathFreeObject(res);
	    }

	    ctxt->context->node = NULL;
	}

	/*
	 * The result is used as the new evaluation set.
	 */
	xmlXPathFreeObject(obj);
	ctxt->context->node = NULL;
	ctxt->context->contextSize = -1;
	ctxt->context->proximityPosition = -1;
	valuePush(ctxt, xmlXPtrWrapLocationSet(newset));
    }
    if (CUR != ']') {
	XP_ERROR(XPATH_INVALID_PREDICATE_ERROR);
    }

    NEXT;
    SKIP_BLANKS;
}